

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O1

void ThreadContext::GlobalInitialize(void)

{
  PropertyRecord *pPVar1;
  int i;
  long lVar2;
  Type TVar3;
  ulong uVar4;
  
  lVar2 = 0;
  do {
    pPVar1 = builtInPropertyRecords[lVar2];
    TVar3 = 0x811c9dc5;
    if (1 < pPVar1->byteCount) {
      uVar4 = 0;
      do {
        TVar3 = (*(ushort *)
                  ((long)&pPVar1[1].super_FinalizableObject.super_IRecyclerVisitedObject.
                          _vptr_IRecyclerVisitedObject + uVar4 * 2) ^ TVar3) * 0x1000193;
        uVar4 = uVar4 + 1;
      } while (pPVar1->byteCount >> 1 != uVar4);
    }
    pPVar1->hash = TVar3;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x2c9);
  return;
}

Assistant:

void ThreadContext::GlobalInitialize()
{
    for (int i = 0; i < _countof(builtInPropertyRecords); i++)
    {
        builtInPropertyRecords[i]->SetHash(JsUtil::CharacterBuffer<WCHAR>::StaticGetHashCode(builtInPropertyRecords[i]->GetBuffer(), builtInPropertyRecords[i]->GetLength()));
    }
}